

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.cpp
# Opt level: O0

void __thiscall
dynamicgraph::Tracer::addSignalToTraceByName(Tracer *this,string *signame,string *filename)

{
  istringstream *piVar1;
  SignalBase<int> *sig_00;
  SignalBase<int> *sig;
  istringstream iss;
  string *filename_local;
  string *signame_local;
  Tracer *this_local;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&sig,signame,8);
  piVar1 = (istringstream *)dynamicgraph::PoolStorage::getInstance();
  sig_00 = (SignalBase<int> *)dynamicgraph::PoolStorage::getSignal(piVar1);
  addSignalToTrace(this,sig_00,filename);
  std::__cxx11::istringstream::~istringstream((istringstream *)&sig);
  return;
}

Assistant:

void Tracer::addSignalToTraceByName(const string &signame,
                                    const string &filename) {
  dgDEBUGIN(15);
  istringstream iss(signame);
  SignalBase<int> &sig = PoolStorage::getInstance()->getSignal(iss);
  addSignalToTrace(sig, filename);
  dgDEBUGOUT(15);
}